

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O0

void charls::transform_line<charls::transform_hp1<unsigned_short>,unsigned_short>
               (triplet<unsigned_short> *destination,triplet<unsigned_short> *source,
               size_t pixel_count,transform_hp1<unsigned_short> *transform,uint32_t mask)

{
  triplet<unsigned_short> tVar1;
  triplet<unsigned_short> *ptVar2;
  ulong local_38;
  size_t i;
  uint32_t mask_local;
  transform_hp1<unsigned_short> *transform_local;
  size_t pixel_count_local;
  triplet<unsigned_short> *source_local;
  triplet<unsigned_short> *destination_local;
  
  for (local_38 = 0; local_38 < pixel_count; local_38 = local_38 + 1) {
    tVar1 = transform_hp1<unsigned_short>::operator()
                      (transform,source[local_38].field_0.v1 & mask,
                       source[local_38].field_1.v2 & mask,source[local_38].field_2.v3 & mask);
    ptVar2 = destination + local_38;
    ptVar2->field_0 = (anon_union_2_2_7f9ecd68_for_triplet<unsigned_short>_1)(short)tVar1._0_4_;
    ptVar2->field_1 =
         (anon_union_2_2_7f9ecc14_for_triplet<unsigned_short>_3)(short)((uint)tVar1._0_4_ >> 0x10);
    (ptVar2->field_2).v3 = (unsigned_short)tVar1.field_2;
  }
  return;
}

Assistant:

void transform_line(triplet<PixelType>* destination, const triplet<PixelType>* source, const size_t pixel_count,
                    Transform& transform, const uint32_t mask) noexcept
{
    for (size_t i{}; i < pixel_count; ++i)
    {
        destination[i] = transform(source[i].v1 & mask, source[i].v2 & mask, source[i].v3 & mask);
    }
}